

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall
kj::_::ForkHubBase::ForkHubBase
          (ForkHubBase *this,OwnPromiseNode *innerParam,ExceptionOrValue *resultRef,
          SourceLocation location)

{
  PromiseNode *pPVar1;
  EventLoop *pEVar2;
  
  (this->super_PromiseArenaMember)._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_0037fb40;
  (this->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR___cxa_pure_virtual_0037fa40;
  pEVar2 = anon_unknown_173::currentEventLoop();
  (this->super_Event).loop = pEVar2;
  (this->super_Event).next = (Event *)0x0;
  (this->super_Event).prev = (Event **)0x0;
  (this->super_Event).firing = false;
  (this->super_Event).live = 0x1e366381;
  *(undefined4 *)&(this->super_Event).location.fileName = location.fileName._0_4_;
  *(undefined4 *)((long)&(this->super_Event).location.fileName + 4) = location.fileName._4_4_;
  *(undefined4 *)&(this->super_Event).location.function = location.function._0_4_;
  *(undefined4 *)((long)&(this->super_Event).location.function + 4) = location.function._4_4_;
  (this->super_Event).location.lineNumber = location.lineNumber;
  (this->super_Event).location.columnNumber = location.columnNumber;
  (this->super_PromiseArenaMember)._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_0037ef58;
  (this->super_Event)._vptr_Event = (_func_int **)&DAT_0037ef80;
  this->refcount = 1;
  (this->inner).ptr = innerParam->ptr;
  innerParam->ptr = (PromiseNode *)0x0;
  this->resultRef = resultRef;
  this->headBranch = (ForkBranchBase *)0x0;
  this->tailBranch = &this->headBranch;
  pPVar1 = (this->inner).ptr;
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[2])(pPVar1,&this->inner);
  pPVar1 = (this->inner).ptr;
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[1])(pPVar1,&this->super_Event);
  return;
}

Assistant:

ForkHubBase::ForkHubBase(OwnPromiseNode&& innerParam, ExceptionOrValue& resultRef,
                         SourceLocation location)
    : Event(location), inner(kj::mv(innerParam)), resultRef(resultRef) {
  inner->setSelfPointer(&inner);
  inner->onReady(this);
}